

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute.cpp
# Opt level: O3

int match(State *initial,P_Sequence *p,bool allpaths)

{
  P_Sequence *pPVar1;
  pointer ppPVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  vector<StateP,_std::allocator<StateP>_> stk;
  vector<StateP,_std::allocator<StateP>_> local_f8;
  State local_e0;
  StateP local_88;
  
  local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Grid::Grid(&local_e0.cg,&initial->cg);
  local_e0.flags = initial->flags;
  local_e0.direction = initial->direction;
  local_e0.position = initial->position;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0.qcount,&initial->qcount);
  StateP::StateP(&local_88,&local_e0,p,0);
  std::vector<StateP,_std::allocator<StateP>_>::emplace_back<StateP>(&local_f8,&local_88);
  if (local_88.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)&local_88);
  if (local_e0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid(&local_e0.cg);
  iVar6 = 0;
  do {
    while( true ) {
      if (local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010d31e;
      uVar7 = (ulong)local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].iseq;
      pPVar1 = local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].seq;
      ppPVar2 = (pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar5 = (long)(pPVar1->v).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3;
      if (uVar5 != uVar7) break;
      local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].iseq = pPVar1->iparent + 1;
      local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1].seq = pPVar1->parent;
    }
    if (uVar5 <= uVar7) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      std::vector<StateP,_std::allocator<StateP>_>::~vector(&local_f8);
      _Unwind_Resume(uVar4);
    }
    iVar3 = Pattern_match(ppPVar2[uVar7],&local_f8);
    if (iVar3 == 1) {
      if (!allpaths) {
        iVar6 = 1;
        goto LAB_0010d31e;
      }
      iVar6 = iVar6 + 1;
      std::vector<StateP,_std::allocator<StateP>_>::pop_back(&local_f8);
    }
  } while ((ulong)(((long)local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_f8.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) < 100000);
  iVar6 = -1;
LAB_0010d31e:
  std::vector<StateP,_std::allocator<StateP>_>::~vector(&local_f8);
  return iVar6;
}

Assistant:

int match(State initial, P_Sequence *p, bool allpaths) {
    int nmatch = 0;
    vector<StateP> stk;
    stk.push_back(StateP{ initial, p, 0 });
    while (!stk.empty()) {
        auto &bk = stk.back();
        if (bk.iseq == bk.seq->v.size()) {
            bk.iseq = bk.seq->iparent + 1;
            bk.seq = bk.seq->parent;
        } else {
            if (Pattern_match(bk.seq->v.at(bk.iseq), stk) == 1) {
                if (!allpaths) return 1;
                nmatch++;
                stk.pop_back();
            }
            if (stk.size() > MAX_PATTERN_STACK) {
                return MATCH_RESULT_OVERFLOW;
            }
        }
    }
    return nmatch;
}